

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O0

void continuous_dist_test_streamable<trng::powerlaw_dist<float>>(powerlaw_dist<float> *d)

{
  StringRef capturedExpression;
  undefined1 uVar1;
  ExprLhs<bool> EVar2;
  param_type *P;
  powerlaw_dist<float> *in_RDI;
  AssertionHandler catchAssertionHandler;
  powerlaw_dist<float> d_new;
  stringstream str;
  param_type p_new;
  undefined4 in_stack_fffffffffffffda8;
  Flags in_stack_fffffffffffffdac;
  undefined6 in_stack_fffffffffffffdb0;
  undefined1 in_stack_fffffffffffffdb6;
  undefined1 in_stack_fffffffffffffdb7;
  SourceLineInfo *this;
  AssertionHandler *this_00;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  param_type *in_stack_fffffffffffffdd8;
  AssertionHandler *in_stack_fffffffffffffde0;
  SourceLineInfo local_218;
  StringRef local_208;
  powerlaw_dist<float> local_1ac [2];
  stringstream local_198 [16];
  AssertionHandler local_188 [5];
  param_type local_10;
  powerlaw_dist<float> *local_8;
  
  local_8 = in_RDI;
  trng::powerlaw_dist<float>::param_type::param_type(&local_10);
  std::__cxx11::stringstream::stringstream(local_198);
  this_00 = local_188;
  P = trng::powerlaw_dist<float>::param(local_8);
  trng::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),P);
  trng::operator>>((basic_istream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffde0,
                   in_stack_fffffffffffffdd8);
  trng::powerlaw_dist<float>::powerlaw_dist(local_1ac,&local_10);
  local_208 = operator____catch_sr
                        ((char *)CONCAT17(in_stack_fffffffffffffdb7,
                                          CONCAT16(in_stack_fffffffffffffdb6,
                                                   in_stack_fffffffffffffdb0)),
                         CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  this = &local_218;
  Catch::SourceLineInfo::SourceLineInfo
            (this,
             "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
             ,0xcd);
  Catch::StringRef::StringRef((StringRef *)this_00,(char *)this);
  capturedExpression.m_size._0_7_ = in_stack_fffffffffffffdd0;
  capturedExpression.m_start = (char *)P;
  capturedExpression.m_size._7_1_ = in_stack_fffffffffffffdd7;
  Catch::AssertionHandler::AssertionHandler
            (this_00,(StringRef *)this,
             (SourceLineInfo *)
             CONCAT17(in_stack_fffffffffffffdb7,
                      CONCAT16(in_stack_fffffffffffffdb6,in_stack_fffffffffffffdb0)),
             capturedExpression,in_stack_fffffffffffffdac);
  uVar1 = trng::operator==((powerlaw_dist<float> *)
                           CONCAT17(in_stack_fffffffffffffdb7,
                                    CONCAT16(in_stack_fffffffffffffdb6,in_stack_fffffffffffffdb0)),
                           (powerlaw_dist<float> *)
                           CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
  EVar2 = Catch::Decomposer::operator<=
                    ((Decomposer *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                     false);
  Catch::AssertionHandler::handleExpr<bool>
            (in_stack_fffffffffffffde0,(ExprLhs<bool> *)in_stack_fffffffffffffdd8);
  Catch::AssertionHandler::complete
            ((AssertionHandler *)CONCAT17(uVar1,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffffdb0)));
  Catch::AssertionHandler::~AssertionHandler
            ((AssertionHandler *)CONCAT17(uVar1,CONCAT16(EVar2.m_lhs,in_stack_fffffffffffffdb0)));
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void continuous_dist_test_streamable(dist &d) {
  typename dist::param_type p_new;
  std::stringstream str;
  str << d.param();
  str >> p_new;
  dist d_new{p_new};
  REQUIRE((d == d_new));
}